

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::SetString
          (Reflection *this,Message *message,FieldDescriptor *field,Cord *value)

{
  byte bVar1;
  CordRep *pCVar2;
  CppStringType CVar3;
  uint32_t uVar4;
  string *dst;
  OneofDescriptor *pOVar5;
  ArenaStringPtr *pAVar6;
  Cord *pCVar7;
  Cord **ppCVar8;
  Nonnull<const_char_*> pcVar9;
  bool bVar10;
  char *description;
  Arena *pAVar11;
  Descriptor *pDVar12;
  uint32_t mask;
  Metadata MVar13;
  uint local_5c;
  string local_58;
  InlinedStringField *local_38;
  ReflectionSchema *this_00;
  
  MVar13 = Message::GetMetadata(message);
  if (MVar13.reflection != this) {
    pDVar12 = this->descriptor_;
    MVar13 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar12,MVar13.descriptor,field,"SetString");
  }
  pDVar12 = this->descriptor_;
  if (field->containing_type_ != pDVar12) {
    description = "Field does not match message type.";
    goto LAB_002a4459;
  }
  bVar1 = field->field_0x1;
  bVar10 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == bVar10) {
    pcVar9 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar9 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (bVar10,0xbf < bVar1,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar9 == (Nonnull<const_char_*>)0x0) {
    if ((field->field_0x1 & 0x20) == 0) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 9) {
        anon_unknown_6::ReportReflectionUsageTypeError
                  (this->descriptor_,field,"SetString",CPPTYPE_STRING);
      }
      if ((field->field_0x1 & 8) != 0) {
        uVar4 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        dst = internal::ExtensionSet::MutableString_abi_cxx11_
                        ((ExtensionSet *)
                         ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),
                         field->number_,field->type_,field);
        absl::lts_20250127::CopyCordToString(value,dst);
        return;
      }
      CVar3 = FieldDescriptor::cpp_string_type(field);
      if ((CVar3 != kView) && (CVar3 != kString)) {
        if (CVar3 != kCord) {
          return;
        }
        bVar10 = internal::ReflectionSchema::InRealOneof(&this->schema_,field);
        if (bVar10) {
          if ((field->field_0x1 & 0x10) == 0) {
            pOVar5 = (OneofDescriptor *)0x0;
          }
          else {
            pOVar5 = (field->scope_).containing_oneof;
            if (pOVar5 == (OneofDescriptor *)0x0) goto LAB_002a4486;
          }
          uVar4 = GetOneofCase(this,message,pOVar5);
          if (uVar4 != field->number_) {
            if ((field->field_0x1 & 0x10) == 0) {
              pOVar5 = (OneofDescriptor *)0x0;
            }
            else {
              pOVar5 = (field->scope_).containing_oneof;
              if (pOVar5 == (OneofDescriptor *)0x0) goto LAB_002a4486;
            }
            ClearOneof(this,message,pOVar5);
            pAVar11 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
            if (((ulong)pAVar11 & 1) != 0) {
              pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
            }
            if (pAVar11 == (Arena *)0x0) {
              pCVar7 = (Cord *)operator_new(0x10);
            }
            else {
              pCVar7 = (Cord *)Arena::AllocateAlignedWithCleanup
                                         (pAVar11,0x10,8,
                                          internal::cleanup::
                                          arena_destruct_object<absl::lts_20250127::Cord>);
            }
            (pCVar7->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
            (pCVar7->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
            ppCVar8 = MutableField<absl::lts_20250127::Cord*>(this,message,field);
            *ppCVar8 = pCVar7;
          }
          ppCVar8 = MutableField<absl::lts_20250127::Cord*>(this,message,field);
          pCVar7 = *ppCVar8;
          if (pCVar7 == value) {
            return;
          }
          if ((((pCVar7->contents_).data_.rep_.field_0.data[0] & 1U) == 0) &&
             (((value->contents_).data_.rep_.field_0.data[0] & 1U) == 0)) {
            pCVar2 = (value->contents_).data_.rep_.field_0.as_tree.rep;
            (pCVar7->contents_).data_.rep_.field_0.as_tree.cordz_info =
                 (value->contents_).data_.rep_.field_0.as_tree.cordz_info;
            (pCVar7->contents_).data_.rep_.field_0.as_tree.rep = pCVar2;
            return;
          }
        }
        else {
          pCVar7 = MutableField<absl::lts_20250127::Cord>(this,message,field);
          if (pCVar7 == value) {
            return;
          }
          if ((((pCVar7->contents_).data_.rep_.field_0.data[0] & 1U) == 0) &&
             (((value->contents_).data_.rep_.field_0.data[0] & 1U) == 0)) {
            pCVar2 = (value->contents_).data_.rep_.field_0.as_tree.rep;
            (pCVar7->contents_).data_.rep_.field_0.as_tree.cordz_info =
                 (value->contents_).data_.rep_.field_0.as_tree.cordz_info;
            (pCVar7->contents_).data_.rep_.field_0.as_tree.rep = pCVar2;
            return;
          }
        }
        absl::lts_20250127::Cord::InlineRep::AssignSlow(&pCVar7->contents_,&value->contents_);
        return;
      }
      this_00 = &this->schema_;
      bVar10 = internal::ReflectionSchema::IsFieldInlined(this_00,field);
      if (!bVar10) {
        bVar10 = internal::ReflectionSchema::InRealOneof(this_00,field);
        if (bVar10) {
          if ((field->field_0x1 & 0x10) == 0) {
            pOVar5 = (OneofDescriptor *)0x0;
          }
          else {
            pOVar5 = (field->scope_).containing_oneof;
            if (pOVar5 == (OneofDescriptor *)0x0) goto LAB_002a4486;
          }
          uVar4 = GetOneofCase(this,message,pOVar5);
          if (uVar4 != field->number_) {
            pOVar5 = FieldDescriptor::containing_oneof(field);
            ClearOneof(this,message,pOVar5);
            pAVar6 = MutableField<google::protobuf::internal::ArenaStringPtr>(this,message,field);
            (pAVar6->tagged_ptr_).ptr_ = &internal::fixed_address_empty_string;
          }
        }
        pAVar6 = MutableField<google::protobuf::internal::ArenaStringPtr>(this,message,field);
        absl::lts_20250127::Cord::operator_cast_to_string(&local_58,value);
        pAVar11 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
        if (((ulong)pAVar11 & 1) != 0) {
          pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set(pAVar6,&local_58,pAVar11);
        goto LAB_002a429c;
      }
      local_38 = MutableField<google::protobuf::internal::InlinedStringField>(this,message,field);
      uVar4 = internal::ReflectionSchema::InlinedStringIndex(this_00,field);
      if (uVar4 == 0) {
        pcVar9 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>(0,0,"index > 0u");
      }
      else {
        pcVar9 = (Nonnull<const_char_*>)0x0;
      }
      if (pcVar9 != (Nonnull<const_char_*>)0x0) {
        SetString();
LAB_002a4486:
        internal::protobuf_assumption_failed
                  ("res != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb31);
      }
      if ((this->schema_).inlined_string_donated_offset_ == -1) {
        SetString();
LAB_002a43e2:
        mask = (uint32_t)this_00;
        value = *(Cord **)((ulong)value & 0xfffffffffffffffe);
      }
      else {
        local_5c = internal::ReflectionSchema::InlinedStringDonatedOffset(this_00);
        bVar1 = (byte)uVar4 & 0x1f;
        mask = -2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1;
        this_00 = (ReflectionSchema *)(ulong)mask;
        absl::lts_20250127::Cord::operator_cast_to_string(&local_58,value);
        value = (Cord *)(message->super_MessageLite)._internal_metadata_.ptr_;
        if (((ulong)value & 1) != 0) goto LAB_002a43e2;
      }
      bVar10 = IsInlinedStringDonated(this,message,field);
      internal::InlinedStringField::Set
                (local_38,&local_58,(Arena *)value,bVar10,
                 (uint32_t *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite +
                 (ulong)(uVar4 >> 5) * 4 + (ulong)local_5c),mask,&message->super_MessageLite);
LAB_002a429c:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  }
  else {
    SetString();
  }
  pDVar12 = this->descriptor_;
  description = "Field is repeated; the method requires a singular field.";
LAB_002a4459:
  anon_unknown_6::ReportReflectionUsageError(pDVar12,field,"SetString",description);
}

Assistant:

void Reflection::SetString(Message* message, const FieldDescriptor* field,
                           const absl::Cord& value) const {
  USAGE_MUTABLE_CHECK_ALL(SetString, SINGULAR, STRING);
  if (field->is_extension()) {
    return absl::CopyCordToString(value,
                                  MutableExtensionSet(message)->MutableString(
                                      field->number(), field->type(), field));
  } else {
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        if (schema_.InRealOneof(field)) {
          if (!HasOneofField(*message, field)) {
            ClearOneof(message, field->containing_oneof());
            *MutableField<absl::Cord*>(message, field) =
                Arena::Create<absl::Cord>(message->GetArena());
          }
          *(*MutableField<absl::Cord*>(message, field)) = value;
        } else {
          *MutableField<absl::Cord>(message, field) = value;
        }
        break;
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString: {
        if (IsInlined(field)) {
          auto* str = MutableField<InlinedStringField>(message, field);
          const uint32_t index = schema_.InlinedStringIndex(field);
          ABSL_DCHECK_GT(index, 0u);
          uint32_t* states =
              &MutableInlinedStringDonatedArray(message)[index / 32];
          uint32_t mask = ~(static_cast<uint32_t>(1) << (index % 32));
          str->Set(std::string(value), message->GetArena(),
                   IsInlinedStringDonated(*message, field), states, mask,
                   message);
        } else if (IsMicroString(field)) {
          if (schema_.InRealOneof(field) && !HasOneofField(*message, field)) {
            ClearOneof(message, field->containing_oneof());
            MutableField<MicroString>(message, field)->InitDefault();
          }
          auto* str = MutableField<MicroString>(message, field);
          str->Set(std::string(value), message->GetArena());
        } else {
          if (schema_.InRealOneof(field) && !HasOneofField(*message, field)) {
            ClearOneof(message, field->containing_oneof());
            MutableField<ArenaStringPtr>(message, field)->InitDefault();
          }
          auto* str = MutableField<ArenaStringPtr>(message, field);
          str->Set(std::string(value), message->GetArena());
        }
        break;
      }
    }
  }
}